

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void legendre_associated(int n,int m,double x,double *cx)

{
  uint uVar1;
  ostream *poVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)m;
  if (m < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of M is ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,m);
    std::operator<<(poVar3,"\n");
    pcVar7 = "  but M must be nonnegative.\n";
  }
  else if (n < m) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of M = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,m);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of N = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,n);
    std::operator<<(poVar3,"\n");
    pcVar7 = "  but M must be less than or equal to N.\n";
  }
  else if (x < -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,x);
    std::operator<<(poVar3,"\n");
    pcVar7 = "  but X must be no less than -1.\n";
  }
  else {
    if (x <= 1.0) {
      if (m == 0) {
        uVar8 = 0;
      }
      else {
        memset(cx,0,uVar2 * 8);
        uVar8 = uVar2;
      }
      cx[uVar8] = 1.0;
      dVar9 = 1.0 - x * x;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar11 = 1.0;
      if (m != 0) {
        dVar10 = cx[uVar8];
        do {
          dVar10 = -dVar10 * dVar11 * dVar9;
          dVar11 = dVar11 + 2.0;
          uVar1 = (int)uVar2 - 1;
          uVar2 = (ulong)uVar1;
        } while (uVar1 != 0);
        cx[uVar8] = dVar10;
      }
      if (m != n) {
        cx[uVar8 + 1] = (double)(m * 2 + 1) * x * cx[uVar8];
        uVar1 = m + 2;
        if ((int)uVar1 <= n) {
          dVar9 = cx[(ulong)uVar1 - 1];
          iVar5 = m * 2 + 3;
          uVar4 = ~(m * 2);
          lVar6 = 0;
          do {
            dVar9 = ((double)(int)uVar4 * cx[(ulong)uVar1 + lVar6 + -2] + (double)iVar5 * x * dVar9)
                    / (double)((int)lVar6 + 2);
            cx[(ulong)uVar1 + lVar6] = dVar9;
            iVar5 = iVar5 + 2;
            uVar4 = uVar4 - 1;
            lVar6 = lVar6 + 1;
          } while (m + 1 + (int)lVar6 < n);
        }
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,x);
    std::operator<<(poVar3,"\n");
    pcVar7 = "  but X must be no more than 1.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void legendre_associated ( int n, int m, double x, double cx[] )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_ASSOCIATED evaluates the associated Legendre functions.
//
//  Differential equation:
//
//    (1-X*X) * Y'' - 2 * X * Y + ( N (N+1) - (M*M/(1-X*X)) * Y = 0
//
//  First terms:
//
//    M = 0  ( = Legendre polynomials of first kind P(N,X) )
//
//    P00 =    1
//    P10 =    1 X
//    P20 = (  3 X^2 -   1)/2
//    P30 = (  5 X^3 -   3 X)/2
//    P40 = ( 35 X^4 -  30 X^2 +   3)/8
//    P50 = ( 63 X^5 -  70 X^3 +  15 X)/8
//    P60 = (231 X^6 - 315 X^4 + 105 X^2 -  5)/16
//    P70 = (429 X^7 - 693 X^5 + 315 X^3 - 35 X)/16
//
//    M = 1
//
//    P01 =   0
//    P11 =   1 * SQRT(1-X*X)
//    P21 =   3 * SQRT(1-X*X) * X
//    P31 = 1.5 * SQRT(1-X*X) * (5*X*X-1)
//    P41 = 2.5 * SQRT(1-X*X) * (7*X*X*X-3*X)
//
//    M = 2
//
//    P02 =   0
//    P12 =   0
//    P22 =   3 * (1-X*X)
//    P32 =  15 * (1-X*X) * X
//    P42 = 7.5 * (1-X*X) * (7*X*X-1)
//
//    M = 3
//
//    P03 =   0
//    P13 =   0
//    P23 =   0
//    P33 =  15 * (1-X*X)^1.5
//    P43 = 105 * (1-X*X)^1.5 * X
//
//    M = 4
//
//    P04 =   0
//    P14 =   0
//    P24 =   0
//    P34 =   0
//    P44 = 105 * (1-X*X)^2
//
//  Recursion:
//
//    if N < M:
//      P(N,M) = 0
//    if N = M:
//      P(N,M) = (2*M-1)!! * (1-X*X)^(M/2) where N!! means the product of
//      all the odd integers less than or equal to N.
//    if N = M+1:
//      P(N,M) = X*(2*M+1)*P(M,M)
//    if M+1 < N:
//      P(N,M) = ( X*(2*N-1)*P(N-1,M) - (N+M-1)*P(N-2,M) )/(N-M)
//
//  Special values:
//
//    P(N,0,X) = P(N,X), that is, for M=0, the associated Legendre
//    function of the first kind equals the Legendre polynomial of the
//    first kind.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the maximum first index of the Legendre
//    function, which must be at least 0.
//
//    Input, int M, the second index of the Legendre function,
//    which must be at least 0, and no greater than N.
//
//    Input, double X, the point at which the function is to be
//    evaluated.  X must satisfy -1 <= X <= 1.
//
//    Output, double CX[N+1], the values of the first N+1 function.
//
{
  double factor;
  int i;
  double somx2;

  if ( m < 0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED - Fatal error!\n";
    std::cerr << "  Input value of M is " << m << "\n";
    std::cerr << "  but M must be nonnegative.\n";
    exit ( 1 );
  }

  if ( n < m )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED - Fatal error!\n";
    std::cerr << "  Input value of M = " << m << "\n";
    std::cerr << "  Input value of N = " << n << "\n";
    std::cerr << "  but M must be less than or equal to N.\n";
    exit ( 1 );
  }

  if ( x < -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no less than -1.\n";
    exit ( 1 );
  }

  if ( 1.0 < x )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no more than 1.\n";
    exit ( 1 );
  }

  for ( i = 0; i <= m-1; i++ )
  {
    cx[i] = 0.0;
  }
  cx[m] = 1.0;

  somx2 = sqrt ( 1.0 - x * x );

  factor = 1.0;
  for ( i = 1; i <= m; i++ )
  {
    cx[m] = -cx[m] * factor * somx2;
    factor = factor + 2.0;
  }

  if ( m == n )
  {
    return;
  }

  cx[m+1] = x * double( 2 * m + 1 ) * cx[m];

  for ( i = m+2; i <= n; i++ )
  {
    cx[i] = ( double( 2 * i     - 1 ) * x * cx[i-1] 
            + double(   - i - m + 1 )     * cx[i-2] ) 
            / double(     i - m     );
  }

  return;
}